

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::SpotLight::SpotLight
          (SpotLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *I,Float scale,Float totalWidth,Float falloffStart,Allocator alloc)

{
  Allocator alloc_00;
  char (*pacVar1) [13];
  float *in_RCX;
  char (*in_RDI) [13];
  undefined4 in_XMM0_Da;
  Float FVar2;
  double dVar3;
  Float in_XMM1_Da;
  Float in_XMM2_Da;
  Float vb;
  Float va;
  MediumInterface *in_stack_ffffffffffffff38;
  Transform *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LightBase *in_stack_ffffffffffffff50;
  DenselySampledSpectrum *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  char (*args_1) [11];
  char *fmt;
  undefined4 in_stack_ffffffffffffffac;
  LogLevel in_stack_ffffffffffffffb4;
  char (*in_stack_ffffffffffffffc0) [13];
  undefined4 in_stack_ffffffffffffffc8;
  
  LightBase::LightBase
            (in_stack_ffffffffffffff50,(LightType)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  args_1 = (char (*) [11])&stack0xffffffffffffffc0;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_ffffffffffffff40,(SpectrumHandle *)in_stack_ffffffffffffff38
            );
  alloc_00.memoryResource._4_4_ = in_stack_ffffffffffffff64;
  alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffff60;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_ffffffffffffff58,(SpectrumHandle *)in_stack_ffffffffffffff50,alloc_00);
  *(undefined4 *)(in_RDI[0xe] + 10) = in_XMM0_Da;
  fmt = in_RDI[0xf] + 1;
  FVar2 = Radians(in_XMM2_Da);
  dVar3 = std::cos((double)(ulong)(uint)FVar2);
  *(int *)fmt = SUB84(dVar3,0);
  pacVar1 = in_RDI + 0xf;
  FVar2 = Radians(in_XMM1_Da);
  dVar3 = std::cos((double)(ulong)(uint)FVar2);
  *(int *)(*pacVar1 + 5) = SUB84(dVar3,0);
  if (in_XMM1_Da < in_XMM2_Da) {
    LogFatal<char_const(&)[13],char_const(&)[11],char_const(&)[13],float&,char_const(&)[11],float&>
              (in_stack_ffffffffffffffb4,(char *)CONCAT44(in_stack_ffffffffffffffac,in_XMM2_Da),
               (int)in_XMM1_Da,fmt,in_RDI,args_1,in_stack_ffffffffffffffc0,
               (float *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffc8),
               (char (*) [11])CONCAT44(in_XMM0_Da,in_XMM1_Da),in_RCX);
  }
  return;
}

Assistant:

SpotLight::SpotLight(const Transform &renderFromLight,
                     const MediumInterface &mediumInterface, SpectrumHandle I,
                     Float scale, Float totalWidth, Float falloffStart, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      I(I, alloc),
      scale(scale),
      cosFalloffEnd(std::cos(Radians(totalWidth))),
      cosFalloffStart(std::cos(Radians(falloffStart))) {
    CHECK_LE(falloffStart, totalWidth);
}